

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhCellWriteOvflPayload(lhcell *pCell,void *pKey,sxu32 nKeylen,...)

{
  lhpage *plVar1;
  lhash_kv_engine *plVar2;
  ulong uVar3;
  unqlite_page *puVar4;
  char in_AL;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  undefined8 in_RCX;
  unqlite_page **ppuVar8;
  uchar *puVar9;
  unqlite_page *puVar10;
  unqlite_page **ppuVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  unqlite_page *puVar12;
  uchar *puVar13;
  uint uVar14;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unqlite_page *pNew;
  va_list ap;
  unqlite_page *local_138;
  unqlite_page *local_130;
  lhash_kv_engine *local_128;
  unqlite_page *local_120;
  undefined8 local_118;
  unqlite_page **local_110;
  undefined1 *local_108;
  unqlite_page *local_100;
  lhcell *local_f8;
  void *local_f0;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  plVar1 = pCell->pPage;
  plVar2 = plVar1->pHash;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar5 = lhAcquirePage(plVar2,&local_138);
  if ((iVar5 != 0) || (iVar5 = (*plVar2->pIo->xWrite)(local_138), iVar5 != 0)) {
    return iVar5;
  }
  uVar3 = local_138->iPage;
  pCell->iOvfl = uVar3;
  *(ulong *)(plVar1->pRaw->zData + (ulong)pCell->iStart + 0x12) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  puVar13 = local_138->zData;
  puVar13[0] = '\0';
  puVar13[1] = '\0';
  puVar13[2] = '\0';
  puVar13[3] = '\0';
  puVar13[4] = '\0';
  puVar13[5] = '\0';
  puVar13[6] = '\0';
  puVar13[7] = '\0';
  puVar13 = local_138->zData + 0x12;
  puVar9 = local_138->zData + plVar2->iPageSize;
  local_130 = local_138;
  local_100 = local_138;
  puVar12 = local_138;
  local_128 = plVar2;
  local_f8 = pCell;
  if (nKeylen != 0) {
    pvVar7 = (void *)((ulong)nKeylen + (long)pKey);
    local_120 = local_138;
    local_f0 = pvVar7;
    do {
      plVar2 = local_128;
      if (puVar9 <= puVar13) {
        iVar5 = lhAcquirePage(local_128,&local_130);
        puVar12 = local_130;
        if (iVar5 != 0) {
          return iVar5;
        }
        iVar5 = (*plVar2->pIo->xWrite)(local_130);
        if (iVar5 != 0) {
          return iVar5;
        }
        uVar3 = puVar12->iPage;
        *(ulong *)local_120->zData =
             uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        (*plVar2->pIo->xPageUnref)(local_120);
        puVar13 = puVar12->zData;
        puVar13[0] = '\0';
        puVar13[1] = '\0';
        puVar13[2] = '\0';
        puVar13[3] = '\0';
        puVar13[4] = '\0';
        puVar13[5] = '\0';
        puVar13[6] = '\0';
        puVar13[7] = '\0';
        puVar13 = puVar12->zData + 8;
        puVar9 = puVar12->zData + plVar2->iPageSize;
        local_120 = puVar12;
      }
      puVar12 = local_120;
      uVar6 = (int)puVar9 - (int)puVar13;
      uVar14 = (int)pvVar7 - (int)pKey;
      if (uVar6 <= uVar14) {
        uVar14 = uVar6;
      }
      SyMemcpy(pKey,puVar13,uVar14);
      pKey = (void *)((long)pKey + (ulong)uVar14);
      puVar13 = puVar13 + uVar14;
    } while (pKey < pvVar7);
  }
  local_118 = 0x3000000018;
  local_110 = &pNew;
  local_108 = local_e8;
  uVar3 = puVar12->iPage;
  local_f8->iDataPage = uVar3;
  local_f8->iDataOfft = (short)puVar13 - (short)*(undefined4 *)&puVar12->zData;
  *(ulong *)(local_100->zData + 8) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  *(sxu16 *)(local_100->zData + 0x10) = local_f8->iDataOfft << 8 | local_f8->iDataOfft >> 8;
  local_138 = puVar12;
  do {
    ppuVar8 = local_110;
    uVar14 = (uint)local_118;
    do {
      if (uVar14 < 0x29) {
        uVar6 = uVar14 + 8;
        local_118 = CONCAT44(local_118._4_4_,uVar6);
        puVar12 = *(unqlite_page **)(local_108 + uVar14);
        ppuVar11 = ppuVar8;
        if (0x20 < uVar14) goto LAB_0011426a;
        ppuVar11 = (unqlite_page **)(local_108 + uVar6);
        local_118 = CONCAT44(local_118._4_4_,uVar14 + 0x10);
        uVar14 = uVar14 + 0x10;
      }
      else {
        puVar12 = *ppuVar8;
        ppuVar11 = ppuVar8 + 1;
        uVar6 = uVar14;
LAB_0011426a:
        ppuVar8 = ppuVar11 + 1;
        uVar14 = uVar6;
        local_110 = ppuVar8;
      }
      if (puVar12 == (unqlite_page *)0x0) {
        (*local_128->pIo->xPageUnref)(local_138);
        return 0;
      }
    } while ((long)*ppuVar11 < 1);
    puVar10 = (unqlite_page *)((long)&puVar12->zData + (long)&(*ppuVar11)->zData);
    do {
      plVar2 = local_128;
      if (puVar9 <= puVar13) {
        iVar5 = lhAcquirePage(local_128,&local_130);
        puVar4 = local_130;
        if (iVar5 != 0) {
          return iVar5;
        }
        iVar5 = (*plVar2->pIo->xWrite)(local_130);
        if (iVar5 != 0) {
          return iVar5;
        }
        uVar3 = puVar4->iPage;
        *(ulong *)local_138->zData =
             uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        (*plVar2->pIo->xPageUnref)(local_138);
        puVar13 = puVar4->zData;
        puVar13[0] = '\0';
        puVar13[1] = '\0';
        puVar13[2] = '\0';
        puVar13[3] = '\0';
        puVar13[4] = '\0';
        puVar13[5] = '\0';
        puVar13[6] = '\0';
        puVar13[7] = '\0';
        local_138 = puVar4;
        puVar13 = puVar4->zData + 8;
        puVar9 = puVar4->zData + plVar2->iPageSize;
      }
      uVar6 = (int)puVar9 - (int)puVar13;
      uVar14 = (int)puVar10 - (int)puVar12;
      if (uVar6 <= uVar14) {
        uVar14 = uVar6;
      }
      SyMemcpy(puVar12,puVar13,uVar14);
      puVar12 = (unqlite_page *)((long)&puVar12->zData + (ulong)uVar14);
      puVar13 = puVar13 + uVar14;
    } while (puVar12 < puVar10);
  } while( true );
}

Assistant:

static int lhCellWriteOvflPayload(lhcell *pCell,const void *pKey,sxu32 nKeylen,...)
{
	lhpage *pPage = pCell->pPage;
	lhash_kv_engine *pEngine = pPage->pHash;
	unqlite_page *pOvfl,*pFirst,*pNew;
	const unsigned char *zPtr,*zEnd;
	unsigned char *zRaw,*zRawEnd;
	sxu32 nAvail;
	va_list ap;
	int rc;
	/* Acquire a new overflow page */
	rc = lhAcquirePage(pEngine,&pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Acquire a writer lock */
	rc = pEngine->pIo->xWrite(pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	pFirst = pOvfl;
	/* Link */
	pCell->iOvfl = pOvfl->iPage;
	/* Update the cell header */
	SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4/*Hash*/ + 4/*Key*/ + 8/*Data*/ + 2 /*Next cell*/],pCell->iOvfl);
	/* Start the write process */
	zPtr = (const unsigned char *)pKey;
	zEnd = &zPtr[nKeylen];
	SyBigEndianPack64(pOvfl->zData,0); /* Next overflow page on the chain */
	zRaw = &pOvfl->zData[8/* Next ovfl page*/ + 8 /* Data page */ + 2 /* Data offset*/];
	zRawEnd = &pOvfl->zData[pEngine->iPageSize];
	pNew = pOvfl;
	/* Write the key */
	for(;;){
		if( zPtr >= zEnd ){
			break;
		}
		if( zRaw >= zRawEnd ){
			/* Acquire a new page */
			rc = lhAcquirePage(pEngine,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			rc = pEngine->pIo->xWrite(pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Link */
			SyBigEndianPack64(pOvfl->zData,pNew->iPage);
			pEngine->pIo->xPageUnref(pOvfl);
			SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
			pOvfl = pNew;
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pEngine->iPageSize];
		}
		nAvail = (sxu32)(zRawEnd-zRaw);
		nKeylen = (sxu32)(zEnd-zPtr);
		if( nKeylen > nAvail ){
			nKeylen = nAvail;
		}
		SyMemcpy((const void *)zPtr,(void *)zRaw,nKeylen);
		/* Synchronize pointers */
		zPtr += nKeylen;
		zRaw += nKeylen;
	}
	rc = UNQLITE_OK;
	va_start(ap,nKeylen);
	pCell->iDataPage = pNew->iPage;
	pCell->iDataOfft = (sxu16)(zRaw-pNew->zData);
	/* Write the data page and its offset */
	SyBigEndianPack64(&pFirst->zData[8/*Next ovfl*/],pCell->iDataPage);
	SyBigEndianPack16(&pFirst->zData[8/*Next ovfl*/+8/*Data page*/],pCell->iDataOfft);
	/* Write data */
	for(;;){
		const void *pData;
		sxu32 nDatalen;
		sxu64 nData;
		pData = va_arg(ap,const void *);
		nData = va_arg(ap,sxu64);
		if( pData == 0 ){
			/* No more chunks */
			break;
		}
		/* Write this chunk */
		zPtr = (const unsigned char *)pData;
		zEnd = &zPtr[nData];
		for(;;){
			if( zPtr >= zEnd ){
				break;
			}
			if( zRaw >= zRawEnd ){
				/* Acquire a new page */
				rc = lhAcquirePage(pEngine,&pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				rc = pEngine->pIo->xWrite(pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				/* Link */
				SyBigEndianPack64(pOvfl->zData,pNew->iPage);
				pEngine->pIo->xPageUnref(pOvfl);
				SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
				pOvfl = pNew;
				zRaw = &pNew->zData[8];
				zRawEnd = &pNew->zData[pEngine->iPageSize];
			}
			nAvail = (sxu32)(zRawEnd-zRaw);
			nDatalen = (sxu32)(zEnd-zPtr);
			if( nDatalen > nAvail ){
				nDatalen = nAvail;
			}
			SyMemcpy((const void *)zPtr,(void *)zRaw,nDatalen);
			/* Synchronize pointers */
			zPtr += nDatalen;
			zRaw += nDatalen;
		}
	}
	/* Unref the overflow page */
	pEngine->pIo->xPageUnref(pOvfl);
	va_end(ap);
	return UNQLITE_OK;
}